

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerHLSL::write_access_chain_value_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,uint32_t value,
          SmallVector<unsigned_int,_8UL> *composite_chain,bool enclose)

{
  size_t sVar1;
  AccessChainMeta meta;
  string local_58;
  AccessChainMeta local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = (composite_chain->super_VectorView<unsigned_int>).buffer_size;
  if (sVar1 == 0) {
    CompilerGLSL::to_expression_abi_cxx11_(&local_58,&this->super_CompilerGLSL,value,true);
  }
  else {
    local_38.relaxed_precision = false;
    local_38.access_meshlet_position_y = false;
    local_38.storage_physical_type = 0;
    local_38.need_transpose = false;
    local_38.storage_is_packed = false;
    local_38.storage_is_invariant = false;
    local_38.flattened_struct = false;
    CompilerGLSL::access_chain_internal_abi_cxx11_
              (&local_58,&this->super_CompilerGLSL,value,
               (composite_chain->super_VectorView<unsigned_int>).ptr,(uint32_t)sVar1,0x11,&local_38)
    ;
  }
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (enclose) {
    CompilerGLSL::enclose_expression(&local_58,&this->super_CompilerGLSL,__return_storage_ptr__);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::write_access_chain_value(uint32_t value, const SmallVector<uint32_t> &composite_chain,
                                              bool enclose)
{
	string ret;
	if (composite_chain.empty())
		ret = to_expression(value);
	else
	{
		AccessChainMeta meta;
		ret = access_chain_internal(value, composite_chain.data(), uint32_t(composite_chain.size()),
		                            ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_LITERAL_MSB_FORCE_ID, &meta);
	}

	if (enclose)
		ret = enclose_expression(ret);
	return ret;
}